

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O1

Operation * __thiscall dxil_spv::Converter::Impl::allocate(Impl *this,Op op,Value *value,Id type_id)

{
  SPIRVModule *this_00;
  ValueKind VVar1;
  Id id;
  Value *this_01;
  Operation *pOVar2;
  
  this_01 = LLVMBC::Internal::resolve_proxy(value);
  VVar1 = LLVMBC::Value::get_value_kind(this_01);
  if (VVar1 == ConstantExpr) {
    __assert_fail("!llvm::isa<llvm::ConstantExpr>(value)",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/dxil_converter.cpp"
                  ,0x1eb5,
                  "Operation *dxil_spv::Converter::Impl::allocate(spv::Op, const LLVMBC::Value *, spv::Id)"
                 );
  }
  if (type_id != 0) {
    this_00 = this->spirv_module;
    id = get_id_for_value(this,value,0);
    pOVar2 = SPIRVModule::allocate_op(this_00,op,id,type_id);
    return pOVar2;
  }
  __assert_fail("type_id != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/dxil_converter.cpp"
                ,0x1eb6,
                "Operation *dxil_spv::Converter::Impl::allocate(spv::Op, const LLVMBC::Value *, spv::Id)"
               );
}

Assistant:

Operation *Converter::Impl::allocate(spv::Op op, const llvm::Value *value, spv::Id type_id)
{
	// Constant expressions cannot have an associated opcode ID to them.
	assert(!llvm::isa<llvm::ConstantExpr>(value));
	assert(type_id != 0);
	return spirv_module.allocate_op(op, get_id_for_value(value), type_id);
}